

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_suba_32_pcix(void)

{
  int *piVar1;
  uint uVar2;
  
  uVar2 = OPER_PCIX_32();
  piVar1 = (int *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c) + 0x20);
  *piVar1 = *piVar1 - uVar2;
  return;
}

Assistant:

static void m68k_op_suba_32_pcix(void)
{
	uint src = OPER_PCIX_32();
	uint* r_dst = &AX;

	*r_dst = MASK_OUT_ABOVE_32(*r_dst - src);
}